

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O1

uint8 * google::protobuf::internal::SerializeInternalToArray
                  (uint8 *base,FieldMetadata *field_metadata_table,int32 num_fields,
                  bool is_deterministic,uint8 *buffer)

{
  FieldMetadata *md;
  float fVar1;
  bool bVar2;
  undefined1 *puVar3;
  int64 iVar4;
  float *pfVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  double *field;
  uint32 *has_bits_array;
  ArrayOutput array_output;
  CodedOutputStream output;
  ArrayOutputStream array_stream;
  ArrayOutput local_b0;
  CodedOutputStream local_a0;
  ArrayOutputStream local_50;
  
  local_b0.ptr = buffer;
  if (0 < num_fields) {
    uVar8 = 0;
    local_b0.is_deterministic = is_deterministic;
    do {
      uVar7 = field_metadata_table[uVar8].type;
      if (100 < uVar7) {
switchD_001cc77b_caseD_12:
        SerializeNotImplemented(uVar7);
        goto LAB_001cd5cd;
      }
      md = field_metadata_table + uVar8;
      field = (double *)(base + md->offset);
      switch(uVar7) {
      case 0:
        if ((*(uint *)(base + (ulong)(md->has_offset >> 5) * 4) >> (md->has_offset & 0x1f) & 1) != 0
           ) {
          uVar7 = md->tag;
          if (uVar7 < 0x80) {
LAB_001cd2e2:
            *local_b0.ptr = (char)uVar7;
            local_b0.ptr = (uint8 *)((long)local_b0.ptr + 1);
          }
          else {
            *local_b0.ptr = (byte)uVar7 | 0x80;
            uVar6 = uVar7 >> 7;
            if (0x3fff < uVar7) {
              local_b0.ptr = (uint8 *)((long)local_b0.ptr + 2);
              do {
                *(byte *)((long)local_b0.ptr + -1) = (byte)uVar6 | 0x80;
                uVar7 = uVar6 >> 7;
                local_b0.ptr = (uint8 *)((long)local_b0.ptr + 1);
                bVar2 = 0x3fff < uVar6;
                uVar6 = uVar7;
              } while (bVar2);
              goto LAB_001cd586;
            }
LAB_001cd510:
            *(char *)((long)local_b0.ptr + 1) = (char)uVar6;
            local_b0.ptr = (uint8 *)((long)local_b0.ptr + 2);
          }
LAB_001cd589:
          *(double *)local_b0.ptr = *field;
          local_b0.ptr = (uint8 *)((long)local_b0.ptr + 8);
        }
        break;
      case 1:
        if ((*(uint *)(base + (ulong)(md->has_offset >> 5) * 4) >> (md->has_offset & 0x1f) & 1) != 0
           ) {
          uVar7 = md->tag;
          if (uVar7 < 0x80) {
LAB_001cd46a:
            *local_b0.ptr = (char)uVar7;
            pfVar5 = (float *)((long)local_b0.ptr + 1);
          }
          else {
            *local_b0.ptr = (byte)uVar7 | 0x80;
            uVar6 = uVar7 >> 7;
            if (0x3fff < uVar7) {
              pfVar5 = (float *)((long)local_b0.ptr + 2);
              do {
                *(byte *)((long)pfVar5 + -1) = (byte)uVar6 | 0x80;
                uVar7 = uVar6 >> 7;
                pfVar5 = (float *)((long)pfVar5 + 1);
                bVar2 = 0x3fff < uVar6;
                uVar6 = uVar7;
              } while (bVar2);
              goto LAB_001cd5b8;
            }
LAB_001cd52d:
            *(char *)((long)local_b0.ptr + 1) = (char)uVar6;
            pfVar5 = (float *)((long)local_b0.ptr + 2);
          }
LAB_001cd5bb:
          *pfVar5 = *(float *)field;
          local_b0.ptr = (uint8 *)(pfVar5 + 1);
        }
        break;
      case 2:
        if ((*(uint *)(base + (ulong)(md->has_offset >> 5) * 4) >> (md->has_offset & 0x1f) & 1) != 0
           ) {
LAB_001cd3a9:
          SingularFieldHelper<3>::Serialize<google::protobuf::internal::ArrayOutput>
                    (field,md,&local_b0);
        }
        break;
      case 3:
        if ((*(uint *)(base + (ulong)(md->has_offset >> 5) * 4) >> (md->has_offset & 0x1f) & 1) != 0
           ) {
LAB_001ccf4c:
          SingularFieldHelper<4>::Serialize<google::protobuf::internal::ArrayOutput>
                    (field,md,&local_b0);
        }
        break;
      case 4:
        fVar1 = (float)(*(uint *)(base + (ulong)(md->has_offset >> 5) * 4) >>
                        (md->has_offset & 0x1f) & 1);
        goto joined_r0x001cd00d;
      case 5:
        if ((*(uint *)(base + (ulong)(md->has_offset >> 5) * 4) >> (md->has_offset & 0x1f) & 1) != 0
           ) {
          uVar7 = md->tag;
          if (uVar7 < 0x80) goto LAB_001cd2e2;
          *local_b0.ptr = (byte)uVar7 | 0x80;
          uVar6 = uVar7 >> 7;
          if (uVar7 < 0x4000) goto LAB_001cd510;
          local_b0.ptr = (uint8 *)((long)local_b0.ptr + 2);
          do {
            *(byte *)((long)local_b0.ptr + -1) = (byte)uVar6 | 0x80;
            uVar7 = uVar6 >> 7;
            local_b0.ptr = (uint8 *)((long)local_b0.ptr + 1);
            bVar2 = 0x3fff < uVar6;
            uVar6 = uVar7;
          } while (bVar2);
LAB_001cd586:
          *(char *)((long)local_b0.ptr + -1) = (char)uVar7;
          goto LAB_001cd589;
        }
        break;
      case 6:
        if ((*(uint *)(base + (ulong)(md->has_offset >> 5) * 4) >> (md->has_offset & 0x1f) & 1) != 0
           ) {
          uVar7 = md->tag;
          if (uVar7 < 0x80) goto LAB_001cd46a;
          *local_b0.ptr = (byte)uVar7 | 0x80;
          uVar6 = uVar7 >> 7;
          if (uVar7 < 0x4000) goto LAB_001cd52d;
          pfVar5 = (float *)((long)local_b0.ptr + 2);
          do {
            *(byte *)((long)pfVar5 + -1) = (byte)uVar6 | 0x80;
            uVar7 = uVar6 >> 7;
            pfVar5 = (float *)((long)pfVar5 + 1);
            bVar2 = 0x3fff < uVar6;
            uVar6 = uVar7;
          } while (bVar2);
LAB_001cd5b8:
          *(char *)((long)pfVar5 + -1) = (char)uVar7;
          goto LAB_001cd5bb;
        }
        break;
      case 7:
        if ((*(uint *)(base + (ulong)(md->has_offset >> 5) * 4) >> (md->has_offset & 0x1f) & 1) != 0
           ) {
          uVar7 = md->tag;
          if (uVar7 < 0x80) {
LAB_001ccdb7:
            *local_b0.ptr = (char)uVar7;
            puVar3 = (undefined1 *)((long)local_b0.ptr + 1);
          }
          else {
            *local_b0.ptr = (byte)uVar7 | 0x80;
            uVar6 = uVar7 >> 7;
            if (0x3fff < uVar7) {
              puVar3 = (undefined1 *)((long)local_b0.ptr + 2);
              do {
                puVar3[-1] = (byte)uVar6 | 0x80;
                uVar7 = uVar6 >> 7;
                puVar3 = puVar3 + 1;
                bVar2 = 0x3fff < uVar6;
                uVar6 = uVar7;
              } while (bVar2);
              goto LAB_001cd557;
            }
LAB_001cd4f3:
            *(char *)((long)local_b0.ptr + 1) = (char)uVar6;
            puVar3 = (undefined1 *)((long)local_b0.ptr + 2);
          }
LAB_001cd55a:
          *puVar3 = *(undefined1 *)field;
          local_b0.ptr = puVar3 + 1;
        }
        break;
      case 8:
      case 0xb:
        if ((*(uint *)(base + (ulong)(md->has_offset >> 5) * 4) >> (md->has_offset & 0x1f) & 1) != 0
           ) {
LAB_001cc7d1:
          SingularFieldHelper<9>::Serialize<google::protobuf::internal::ArrayOutput>
                    (field,md,&local_b0);
        }
        break;
      case 9:
        if ((*(uint *)(base + (ulong)(md->has_offset >> 5) * 4) >> (md->has_offset & 0x1f) & 1) != 0
           ) {
LAB_001cd1ef:
          SingularFieldHelper<10>::Serialize<google::protobuf::internal::ArrayOutput>
                    (field,md,&local_b0);
        }
        break;
      case 10:
        if ((*(uint *)(base + (ulong)(md->has_offset >> 5) * 4) >> (md->has_offset & 0x1f) & 1) != 0
           ) {
LAB_001cd124:
          SingularFieldHelper<11>::Serialize<google::protobuf::internal::ArrayOutput>
                    (field,md,&local_b0);
        }
        break;
      case 0xc:
        fVar1 = (float)(*(uint *)(base + (ulong)(md->has_offset >> 5) * 4) >>
                        (md->has_offset & 0x1f) & 1);
        goto joined_r0x001cd228;
      case 0xd:
        fVar1 = (float)(*(uint *)(base + (ulong)(md->has_offset >> 5) * 4) >>
                        (md->has_offset & 0x1f) & 1);
        goto joined_r0x001ccff2;
      case 0xe:
        if ((*(uint *)(base + (ulong)(md->has_offset >> 5) * 4) >> (md->has_offset & 0x1f) & 1) != 0
           ) {
          uVar7 = md->tag;
          if (uVar7 < 0x80) goto LAB_001cd46a;
          *local_b0.ptr = (byte)uVar7 | 0x80;
          uVar6 = uVar7 >> 7;
          if (uVar7 < 0x4000) goto LAB_001cd52d;
          pfVar5 = (float *)((long)local_b0.ptr + 2);
          do {
            *(byte *)((long)pfVar5 + -1) = (byte)uVar6 | 0x80;
            uVar7 = uVar6 >> 7;
            pfVar5 = (float *)((long)pfVar5 + 1);
            bVar2 = 0x3fff < uVar6;
            uVar6 = uVar7;
          } while (bVar2);
          goto LAB_001cd5b8;
        }
        break;
      case 0xf:
        if ((*(uint *)(base + (ulong)(md->has_offset >> 5) * 4) >> (md->has_offset & 0x1f) & 1) != 0
           ) {
          uVar7 = md->tag;
          if (uVar7 < 0x80) goto LAB_001cd2e2;
          *local_b0.ptr = (byte)uVar7 | 0x80;
          uVar6 = uVar7 >> 7;
          if (uVar7 < 0x4000) goto LAB_001cd510;
          local_b0.ptr = (uint8 *)((long)local_b0.ptr + 2);
          do {
            *(byte *)((long)local_b0.ptr + -1) = (byte)uVar6 | 0x80;
            uVar7 = uVar6 >> 7;
            local_b0.ptr = (uint8 *)((long)local_b0.ptr + 1);
            bVar2 = 0x3fff < uVar6;
            uVar6 = uVar7;
          } while (bVar2);
          goto LAB_001cd586;
        }
        break;
      case 0x10:
        fVar1 = (float)(*(uint *)(base + (ulong)(md->has_offset >> 5) * 4) >>
                        (md->has_offset & 0x1f) & 1);
        goto joined_r0x001cd2ef;
      case 0x11:
        if ((*(uint *)(base + (ulong)(md->has_offset >> 5) * 4) >> (md->has_offset & 0x1f) & 1) != 0
           ) {
LAB_001cd3fb:
          SingularFieldHelper<18>::Serialize<google::protobuf::internal::ArrayOutput>
                    (field,md,&local_b0);
        }
        break;
      default:
        goto switchD_001cc77b_caseD_12;
      case 0x14:
        if ((*field != 0.0) || (NAN(*field))) {
          uVar7 = md->tag;
          if (uVar7 < 0x80) goto LAB_001cd2e2;
          *local_b0.ptr = (byte)uVar7 | 0x80;
          uVar6 = uVar7 >> 7;
          if (uVar7 < 0x4000) goto LAB_001cd510;
          local_b0.ptr = (uint8 *)((long)local_b0.ptr + 2);
          do {
            *(byte *)((long)local_b0.ptr + -1) = (byte)uVar6 | 0x80;
            uVar7 = uVar6 >> 7;
            local_b0.ptr = (uint8 *)((long)local_b0.ptr + 1);
            bVar2 = 0x3fff < uVar6;
            uVar6 = uVar7;
          } while (bVar2);
          goto LAB_001cd586;
        }
        break;
      case 0x15:
        if ((*(float *)field != 0.0) || (NAN(*(float *)field))) {
          uVar7 = md->tag;
          if (uVar7 < 0x80) goto LAB_001cd46a;
          *local_b0.ptr = (byte)uVar7 | 0x80;
          uVar6 = uVar7 >> 7;
          if (uVar7 < 0x4000) goto LAB_001cd52d;
          pfVar5 = (float *)((long)local_b0.ptr + 2);
          do {
            *(byte *)((long)pfVar5 + -1) = (byte)uVar6 | 0x80;
            uVar7 = uVar6 >> 7;
            pfVar5 = (float *)((long)pfVar5 + 1);
            bVar2 = 0x3fff < uVar6;
            uVar6 = uVar7;
          } while (bVar2);
          goto LAB_001cd5b8;
        }
        break;
      case 0x16:
        if (*field != 0.0) goto LAB_001cd3a9;
        break;
      case 0x17:
        if (*field != 0.0) goto LAB_001ccf4c;
        break;
      case 0x18:
        fVar1 = *(float *)field;
joined_r0x001cd00d:
        if (fVar1 != 0.0) {
LAB_001cd4c1:
          SingularFieldHelper<5>::Serialize<google::protobuf::internal::ArrayOutput>
                    (field,md,&local_b0);
        }
        break;
      case 0x19:
        if (*field != 0.0) {
          uVar7 = md->tag;
          if (uVar7 < 0x80) goto LAB_001cd2e2;
          *local_b0.ptr = (byte)uVar7 | 0x80;
          uVar6 = uVar7 >> 7;
          if (uVar7 < 0x4000) goto LAB_001cd510;
          local_b0.ptr = (uint8 *)((long)local_b0.ptr + 2);
          do {
            *(byte *)((long)local_b0.ptr + -1) = (byte)uVar6 | 0x80;
            uVar7 = uVar6 >> 7;
            local_b0.ptr = (uint8 *)((long)local_b0.ptr + 1);
            bVar2 = 0x3fff < uVar6;
            uVar6 = uVar7;
          } while (bVar2);
          goto LAB_001cd586;
        }
        break;
      case 0x1a:
        if (*(float *)field != 0.0) {
          uVar7 = md->tag;
          if (uVar7 < 0x80) goto LAB_001cd46a;
          *local_b0.ptr = (byte)uVar7 | 0x80;
          uVar6 = uVar7 >> 7;
          if (uVar7 < 0x4000) goto LAB_001cd52d;
          pfVar5 = (float *)((long)local_b0.ptr + 2);
          do {
            *(byte *)((long)pfVar5 + -1) = (byte)uVar6 | 0x80;
            uVar7 = uVar6 >> 7;
            pfVar5 = (float *)((long)pfVar5 + 1);
            bVar2 = 0x3fff < uVar6;
            uVar6 = uVar7;
          } while (bVar2);
          goto LAB_001cd5b8;
        }
        break;
      case 0x1b:
        if (*(char *)field != '\0') {
          uVar7 = md->tag;
          if (uVar7 < 0x80) goto LAB_001ccdb7;
          *local_b0.ptr = (byte)uVar7 | 0x80;
          uVar6 = uVar7 >> 7;
          if (uVar7 < 0x4000) goto LAB_001cd4f3;
          puVar3 = (undefined1 *)((long)local_b0.ptr + 2);
          do {
            puVar3[-1] = (byte)uVar6 | 0x80;
            uVar7 = uVar6 >> 7;
            puVar3 = puVar3 + 1;
            bVar2 = 0x3fff < uVar6;
            uVar6 = uVar7;
          } while (bVar2);
LAB_001cd557:
          puVar3[-1] = (char)uVar7;
          goto LAB_001cd55a;
        }
        break;
      case 0x1c:
      case 0x1f:
        if (*(long *)(((ulong)*field & 0xfffffffffffffffe) + 8) != 0) goto LAB_001cc7d1;
        break;
      case 0x1d:
        if (*field != 0.0) goto LAB_001cd1ef;
        break;
      case 0x1e:
        if (*field != 0.0) goto LAB_001cd124;
        break;
      case 0x20:
        fVar1 = *(float *)field;
joined_r0x001cd228:
        if (fVar1 != 0.0) {
LAB_001cd22e:
          SingularFieldHelper<13>::Serialize<google::protobuf::internal::ArrayOutput>
                    (field,md,&local_b0);
        }
        break;
      case 0x21:
        fVar1 = *(float *)field;
joined_r0x001ccff2:
        if (fVar1 != 0.0) {
LAB_001ccff8:
          SingularFieldHelper<14>::Serialize<google::protobuf::internal::ArrayOutput>
                    (field,md,&local_b0);
        }
        break;
      case 0x22:
        if (*(float *)field != 0.0) {
          uVar7 = md->tag;
          if (uVar7 < 0x80) goto LAB_001cd46a;
          *local_b0.ptr = (byte)uVar7 | 0x80;
          uVar6 = uVar7 >> 7;
          if (uVar7 < 0x4000) goto LAB_001cd52d;
          pfVar5 = (float *)((long)local_b0.ptr + 2);
          do {
            *(byte *)((long)pfVar5 + -1) = (byte)uVar6 | 0x80;
            uVar7 = uVar6 >> 7;
            pfVar5 = (float *)((long)pfVar5 + 1);
            bVar2 = 0x3fff < uVar6;
            uVar6 = uVar7;
          } while (bVar2);
          goto LAB_001cd5b8;
        }
        break;
      case 0x23:
        if (*field != 0.0) {
          uVar7 = md->tag;
          if (uVar7 < 0x80) goto LAB_001cd2e2;
          *local_b0.ptr = (byte)uVar7 | 0x80;
          uVar6 = uVar7 >> 7;
          if (uVar7 < 0x4000) goto LAB_001cd510;
          local_b0.ptr = (uint8 *)((long)local_b0.ptr + 2);
          do {
            *(byte *)((long)local_b0.ptr + -1) = (byte)uVar6 | 0x80;
            uVar7 = uVar6 >> 7;
            local_b0.ptr = (uint8 *)((long)local_b0.ptr + 1);
            bVar2 = 0x3fff < uVar6;
            uVar6 = uVar7;
          } while (bVar2);
          goto LAB_001cd586;
        }
        break;
      case 0x24:
        fVar1 = *(float *)field;
joined_r0x001cd2ef:
        if (fVar1 != 0.0) {
LAB_001cd345:
          SingularFieldHelper<17>::Serialize<google::protobuf::internal::ArrayOutput>
                    (field,md,&local_b0);
        }
        break;
      case 0x25:
        if (*field != 0.0) goto LAB_001cd3fb;
        break;
      case 0x28:
        RepeatedFieldHelper<1>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,&local_b0);
        break;
      case 0x29:
        RepeatedFieldHelper<2>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,&local_b0);
        break;
      case 0x2a:
        RepeatedFieldHelper<3>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,&local_b0);
        break;
      case 0x2b:
        RepeatedFieldHelper<4>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,&local_b0);
        break;
      case 0x2c:
        RepeatedFieldHelper<5>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,&local_b0);
        break;
      case 0x2d:
        RepeatedFieldHelper<6>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,&local_b0);
        break;
      case 0x2e:
        RepeatedFieldHelper<7>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,&local_b0);
        break;
      case 0x2f:
        RepeatedFieldHelper<8>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,&local_b0);
        break;
      case 0x30:
      case 0x33:
        RepeatedFieldHelper<9>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,&local_b0);
        break;
      case 0x31:
        RepeatedFieldHelper<10>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,&local_b0);
        break;
      case 0x32:
        RepeatedFieldHelper<11>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,&local_b0);
        break;
      case 0x34:
        RepeatedFieldHelper<13>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,&local_b0);
        break;
      case 0x35:
        RepeatedFieldHelper<14>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,&local_b0);
        break;
      case 0x36:
        RepeatedFieldHelper<15>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,&local_b0);
        break;
      case 0x37:
        RepeatedFieldHelper<16>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,&local_b0);
        break;
      case 0x38:
        RepeatedFieldHelper<17>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,&local_b0);
        break;
      case 0x39:
        RepeatedFieldHelper<18>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,&local_b0);
        break;
      case 0x3c:
        PackedFieldHelper<1>::Serialize<google::protobuf::internal::ArrayOutput>(field,md,&local_b0)
        ;
        break;
      case 0x3d:
        PackedFieldHelper<2>::Serialize<google::protobuf::internal::ArrayOutput>(field,md,&local_b0)
        ;
        break;
      case 0x3e:
        PackedFieldHelper<3>::Serialize<google::protobuf::internal::ArrayOutput>(field,md,&local_b0)
        ;
        break;
      case 0x3f:
        PackedFieldHelper<4>::Serialize<google::protobuf::internal::ArrayOutput>(field,md,&local_b0)
        ;
        break;
      case 0x40:
        PackedFieldHelper<5>::Serialize<google::protobuf::internal::ArrayOutput>(field,md,&local_b0)
        ;
        break;
      case 0x41:
        PackedFieldHelper<6>::Serialize<google::protobuf::internal::ArrayOutput>(field,md,&local_b0)
        ;
        break;
      case 0x42:
        PackedFieldHelper<7>::Serialize<google::protobuf::internal::ArrayOutput>(field,md,&local_b0)
        ;
        break;
      case 0x43:
        PackedFieldHelper<8>::Serialize<google::protobuf::internal::ArrayOutput>(field,md,&local_b0)
        ;
        break;
      case 0x44:
      case 0x45:
      case 0x46:
      case 0x47:
        PackedFieldHelper<9>::Serialize<google::protobuf::internal::ArrayOutput>(field,md,&local_b0)
        ;
        break;
      case 0x48:
        PackedFieldHelper<13>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,&local_b0);
        break;
      case 0x49:
        PackedFieldHelper<14>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,&local_b0);
        break;
      case 0x4a:
        PackedFieldHelper<15>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,&local_b0);
        break;
      case 0x4b:
        PackedFieldHelper<16>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,&local_b0);
        break;
      case 0x4c:
        PackedFieldHelper<17>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,&local_b0);
        break;
      case 0x4d:
        PackedFieldHelper<18>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,&local_b0);
        break;
      case 0x50:
        uVar7 = md->tag;
        if (*(uint *)(base + md->has_offset) == uVar7 >> 3) {
          if (uVar7 < 0x80) goto LAB_001cd2e2;
          *local_b0.ptr = (byte)uVar7 | 0x80;
          uVar6 = uVar7 >> 7;
          if (uVar7 < 0x4000) goto LAB_001cd510;
          local_b0.ptr = (uint8 *)((long)local_b0.ptr + 2);
          do {
            *(byte *)((long)local_b0.ptr + -1) = (byte)uVar6 | 0x80;
            uVar7 = uVar6 >> 7;
            local_b0.ptr = (uint8 *)((long)local_b0.ptr + 1);
            bVar2 = 0x3fff < uVar6;
            uVar6 = uVar7;
          } while (bVar2);
          goto LAB_001cd586;
        }
        break;
      case 0x51:
        uVar7 = md->tag;
        if (*(uint *)(base + md->has_offset) == uVar7 >> 3) {
          if (uVar7 < 0x80) goto LAB_001cd46a;
          *local_b0.ptr = (byte)uVar7 | 0x80;
          uVar6 = uVar7 >> 7;
          if (uVar7 < 0x4000) goto LAB_001cd52d;
          pfVar5 = (float *)((long)local_b0.ptr + 2);
          do {
            *(byte *)((long)pfVar5 + -1) = (byte)uVar6 | 0x80;
            uVar7 = uVar6 >> 7;
            pfVar5 = (float *)((long)pfVar5 + 1);
            bVar2 = 0x3fff < uVar6;
            uVar6 = uVar7;
          } while (bVar2);
          goto LAB_001cd5b8;
        }
        break;
      case 0x52:
        if (*(uint *)(base + md->has_offset) == md->tag >> 3) goto LAB_001cd3a9;
        break;
      case 0x53:
        if (*(uint *)(base + md->has_offset) == md->tag >> 3) goto LAB_001ccf4c;
        break;
      case 0x54:
        if (*(uint *)(base + md->has_offset) != md->tag >> 3) break;
        goto LAB_001cd4c1;
      case 0x55:
        uVar7 = md->tag;
        if (*(uint *)(base + md->has_offset) == uVar7 >> 3) {
          if (uVar7 < 0x80) goto LAB_001cd2e2;
          *local_b0.ptr = (byte)uVar7 | 0x80;
          uVar6 = uVar7 >> 7;
          if (uVar7 < 0x4000) goto LAB_001cd510;
          local_b0.ptr = (uint8 *)((long)local_b0.ptr + 2);
          do {
            *(byte *)((long)local_b0.ptr + -1) = (byte)uVar6 | 0x80;
            uVar7 = uVar6 >> 7;
            local_b0.ptr = (uint8 *)((long)local_b0.ptr + 1);
            bVar2 = 0x3fff < uVar6;
            uVar6 = uVar7;
          } while (bVar2);
          goto LAB_001cd586;
        }
        break;
      case 0x56:
        uVar7 = md->tag;
        if (*(uint *)(base + md->has_offset) == uVar7 >> 3) {
          if (uVar7 < 0x80) goto LAB_001cd46a;
          *local_b0.ptr = (byte)uVar7 | 0x80;
          uVar6 = uVar7 >> 7;
          if (uVar7 < 0x4000) goto LAB_001cd52d;
          pfVar5 = (float *)((long)local_b0.ptr + 2);
          do {
            *(byte *)((long)pfVar5 + -1) = (byte)uVar6 | 0x80;
            uVar7 = uVar6 >> 7;
            pfVar5 = (float *)((long)pfVar5 + 1);
            bVar2 = 0x3fff < uVar6;
            uVar6 = uVar7;
          } while (bVar2);
          goto LAB_001cd5b8;
        }
        break;
      case 0x57:
        uVar7 = md->tag;
        if (*(uint *)(base + md->has_offset) == uVar7 >> 3) {
          if (uVar7 < 0x80) goto LAB_001ccdb7;
          *local_b0.ptr = (byte)uVar7 | 0x80;
          uVar6 = uVar7 >> 7;
          if (uVar7 < 0x4000) goto LAB_001cd4f3;
          puVar3 = (undefined1 *)((long)local_b0.ptr + 2);
          do {
            puVar3[-1] = (byte)uVar6 | 0x80;
            uVar7 = uVar6 >> 7;
            puVar3 = puVar3 + 1;
            bVar2 = 0x3fff < uVar6;
            uVar6 = uVar7;
          } while (bVar2);
          goto LAB_001cd557;
        }
        break;
      case 0x58:
      case 0x5b:
        if (*(uint *)(base + md->has_offset) == md->tag >> 3) goto LAB_001cc7d1;
        break;
      case 0x59:
        if (*(uint *)(base + md->has_offset) == md->tag >> 3) goto LAB_001cd1ef;
        break;
      case 0x5a:
        if (*(uint *)(base + md->has_offset) == md->tag >> 3) goto LAB_001cd124;
        break;
      case 0x5c:
        if (*(uint *)(base + md->has_offset) != md->tag >> 3) break;
        goto LAB_001cd22e;
      case 0x5d:
        if (*(uint *)(base + md->has_offset) != md->tag >> 3) break;
        goto LAB_001ccff8;
      case 0x5e:
        uVar7 = md->tag;
        if (*(uint *)(base + md->has_offset) == uVar7 >> 3) {
          if (uVar7 < 0x80) goto LAB_001cd46a;
          *local_b0.ptr = (byte)uVar7 | 0x80;
          uVar6 = uVar7 >> 7;
          if (uVar7 < 0x4000) goto LAB_001cd52d;
          pfVar5 = (float *)((long)local_b0.ptr + 2);
          do {
            *(byte *)((long)pfVar5 + -1) = (byte)uVar6 | 0x80;
            uVar7 = uVar6 >> 7;
            pfVar5 = (float *)((long)pfVar5 + 1);
            bVar2 = 0x3fff < uVar6;
            uVar6 = uVar7;
          } while (bVar2);
          goto LAB_001cd5b8;
        }
        break;
      case 0x5f:
        uVar7 = md->tag;
        if (*(uint *)(base + md->has_offset) == uVar7 >> 3) {
          if (uVar7 < 0x80) goto LAB_001cd2e2;
          *local_b0.ptr = (byte)uVar7 | 0x80;
          uVar6 = uVar7 >> 7;
          if (uVar7 < 0x4000) goto LAB_001cd510;
          local_b0.ptr = (uint8 *)((long)local_b0.ptr + 2);
          do {
            *(byte *)((long)local_b0.ptr + -1) = (byte)uVar6 | 0x80;
            uVar7 = uVar6 >> 7;
            local_b0.ptr = (uint8 *)((long)local_b0.ptr + 1);
            bVar2 = 0x3fff < uVar6;
            uVar6 = uVar7;
          } while (bVar2);
          goto LAB_001cd586;
        }
        break;
      case 0x60:
        if (*(uint *)(base + md->has_offset) != md->tag >> 3) break;
        goto LAB_001cd345;
      case 0x61:
        if (*(uint *)(base + md->has_offset) == md->tag >> 3) goto LAB_001cd3fb;
        break;
      case 100:
        io::ArrayOutputStream::ArrayOutputStream(&local_50,local_b0.ptr,0x7fffffff,-1);
        io::CodedOutputStream::CodedOutputStream
                  (&local_a0,&local_50.super_ZeroCopyOutputStream,true);
        local_a0.impl_.is_serialization_deterministic_ = is_deterministic;
        (*(code *)md->ptr)(base,md->offset,md->tag,md->has_offset);
        iVar4 = io::EpsCopyOutputStream::ByteCount(&local_a0.impl_,local_a0.cur_);
        local_b0.ptr = (uint8 *)((long)local_b0.ptr +
                                (long)((int)iVar4 - (int)local_a0.start_count_));
        io::CodedOutputStream::~CodedOutputStream(&local_a0);
      }
LAB_001cd5cd:
      uVar8 = uVar8 + 1;
    } while (uVar8 != (uint)num_fields);
  }
  return (uint8 *)(double *)local_b0.ptr;
}

Assistant:

uint8* SerializeInternalToArray(const uint8* base,
                                const FieldMetadata* field_metadata_table,
                                int32 num_fields, bool is_deterministic,
                                uint8* buffer) {
  ArrayOutput array_output = {buffer, is_deterministic};
  ArrayOutput* output = &array_output;
  SpecialSerializer func = nullptr;
  for (int i = 0; i < num_fields; i++) {
    const FieldMetadata& field_metadata = field_metadata_table[i];
    const uint8* ptr = base + field_metadata.offset;
    switch (field_metadata.type) {
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_DOUBLE);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_FLOAT);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_INT64);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_UINT64);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_INT32);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_FIXED64);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_FIXED32);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_BOOL);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_STRING);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_GROUP);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_MESSAGE);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_BYTES);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_UINT32);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_ENUM);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_SFIXED32);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_SFIXED64);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_SINT32);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_SINT64);
      // Special cases
      case FieldMetadata::kSpecial: {
        io::ArrayOutputStream array_stream(array_output.ptr, INT_MAX);
        io::CodedOutputStream output(&array_stream);
        output.SetSerializationDeterministic(is_deterministic);
        func = reinterpret_cast<SpecialSerializer>(
            const_cast<void*>(field_metadata.ptr));
        func(base, field_metadata.offset, field_metadata.tag,
             field_metadata.has_offset, &output);
        array_output.ptr += output.ByteCount();
      } break;
      default:
        // __builtin_unreachable()
        SerializeNotImplemented(field_metadata.type);
    }
  }
  return array_output.ptr;
}